

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O0

int code_index_in_array(char **code_name,char *code)

{
  int iVar1;
  int local_24;
  int i;
  char *code_local;
  char **code_name_local;
  
  local_24 = 0;
  while( true ) {
    if (code_name[local_24] == (char *)0x0) {
      return -1;
    }
    iVar1 = strcmp(code_name[local_24],code);
    if (iVar1 == 0) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

int code_index_in_array(const char *code_name[], const char *code)
{
	int i = 0;

	while (code_name[i]) {
		if (streq(code_name[i], code)) {
			return i;
		}
		i++;
	}

	return -1;
}